

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int ly_set_add(ly_set *set,void *node,int options)

{
  ulong uVar1;
  lys_node **pplVar2;
  LY_ERR *pLVar3;
  
  if (set == (ly_set *)0x0 || node == (void *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
LAB_0015eb4e:
    uVar1 = 0xffffffff;
  }
  else {
    if (((options & 1U) == 0) && (set->number != 0)) {
      uVar1 = 0;
      do {
        if ((set->set).s[uVar1] == (lys_node *)node) goto LAB_0015eb53;
        uVar1 = uVar1 + 1;
      } while (set->number != (uint)uVar1);
    }
    if (set->size == set->number) {
      pplVar2 = (lys_node **)realloc((set->set).s,(ulong)(set->size + 8) << 3);
      if (pplVar2 == (lys_node **)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","ly_set_add");
        goto LAB_0015eb4e;
      }
      set->size = set->size + 8;
      (set->set).s = pplVar2;
    }
    uVar1 = (ulong)set->number;
    set->number = set->number + 1;
    (set->set).s[uVar1] = (lys_node *)node;
  }
LAB_0015eb53:
  return (int)uVar1;
}

Assistant:

API int
ly_set_add(struct ly_set *set, void *node, int options)
{
    unsigned int i;
    void **new;

    if (!set || !node) {
        ly_errno = LY_EINVAL;
        return -1;
    }

    if (!(options & LY_SET_OPT_USEASLIST)) {
        /* search for duplication */
        for (i = 0; i < set->number; i++) {
            if (set->set.g[i] == node) {
                /* already in set */
                return i;
            }
        }
    }

    if (set->size == set->number) {
        new = realloc(set->set.g, (set->size + 8) * sizeof *(set->set.g));
        if (!new) {
            LOGMEM;
            return -1;
        }
        set->size += 8;
        set->set.g = new;
    }

    set->set.g[set->number++] = node;

    return set->number - 1;
}